

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::qualConstraintViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  int iVar2;
  Item *pIVar3;
  DataKey *pDVar4;
  pointer pdVar5;
  pointer pdVar6;
  Nonzero<double> *pNVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  VectorBase<double> solu;
  VectorBase<double> local_38;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  VectorBase<double>::VectorBase
            (&local_38,
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x60])(this,&local_38);
  lVar8 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                set.thenum;
  if (0 < lVar8) {
    pIVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             theitem;
    pDVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thekey;
    pdVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar9 = 0;
    do {
      iVar2 = pDVar4[lVar9].idx;
      lVar10 = (long)pIVar3[iVar2].data.super_SVectorBase<double>.memused;
      if (lVar10 < 1) {
        dVar12 = 0.0;
      }
      else {
        pNVar7 = pIVar3[iVar2].data.super_SVectorBase<double>.m_elem;
        dVar12 = 0.0;
        lVar11 = 0;
        do {
          dVar12 = dVar12 + *(double *)((long)&pNVar7->val + lVar11) *
                            local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start[*(int *)((long)&pNVar7->idx + lVar11)]
          ;
          lVar11 = lVar11 + 0x10;
        } while (lVar10 * 0x10 != lVar11);
      }
      dVar1 = pdVar5[lVar9];
      if (dVar1 <= dVar12) {
        dVar1 = pdVar6[lVar9];
        dVar13 = 0.0;
        if (dVar1 < dVar12) goto LAB_001e12ce;
      }
      else {
LAB_001e12ce:
        dVar13 = ABS(dVar12 - dVar1);
      }
      if (*maxviol <= dVar13 && dVar13 != *maxviol) {
        *maxviol = dVar13;
      }
      *sumviol = dVar13 + *sumviol;
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar8);
  }
  if (local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}